

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O0

int parg_getopt_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
                    int *longindex)

{
  int iVar1;
  int *longindex_local;
  parg_option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  parg_state *ps_local;
  
  if (ps == (parg_state *)0x0) {
    __assert_fail("ps != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa2
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa3
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa4
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  ps->optarg = (char *)0x0;
  if (1 < argc) {
    if ((ps->nextchar == (char *)0x0) || (*ps->nextchar == '\0')) {
      iVar1 = is_argv_end(ps,argc,argv);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = ps->optind;
      ps->optind = iVar1 + 1;
      ps->nextchar = argv[iVar1];
      if ((*ps->nextchar != '-') || (ps->nextchar[1] == '\0')) {
        ps->optarg = ps->nextchar;
        ps->nextchar = (char *)0x0;
        return 1;
      }
      if (ps->nextchar[1] == '-') {
        if (ps->nextchar[2] == '\0') {
          ps->nextchar = (char *)0x0;
          return -1;
        }
        if (longopts != (parg_option *)0x0) {
          ps->nextchar = ps->nextchar + 2;
          iVar1 = match_long(ps,argc,argv,optstring,longopts,longindex);
          return iVar1;
        }
      }
      ps->nextchar = ps->nextchar + 1;
    }
    iVar1 = match_short(ps,argc,argv,optstring);
    return iVar1;
  }
  return -1;
}

Assistant:

int
parg_getopt_long(struct parg_state *ps, int argc, char *const argv[],
                 const char *optstring,
                 const struct parg_option *longopts, int *longindex)
{
	assert(ps != NULL);
	assert(argv != NULL);
	assert(optstring != NULL);

	ps->optarg = NULL;

	if (argc < 2) {
		return -1;
	}

	/* Advance to next element if needed */
	if (ps->nextchar == NULL || *ps->nextchar == '\0') {
		if (is_argv_end(ps, argc, argv)) {
			return -1;
		}

		ps->nextchar = argv[ps->optind++];

		/* Check for nonoption element (including '-') */
		if (ps->nextchar[0] != '-' || ps->nextchar[1] == '\0') {
			ps->optarg = ps->nextchar;
			ps->nextchar = NULL;
			return 1;
		}

		/* Check for '--' */
		if (ps->nextchar[1] == '-') {
			if (ps->nextchar[2] == '\0') {
				ps->nextchar = NULL;
				return -1;
			}

			if (longopts != NULL) {
				ps->nextchar += 2;

				return match_long(ps, argc, argv, optstring,
				                  longopts, longindex);
			}
		}

		ps->nextchar++;
	}

	/* Match nextchar */
	return match_short(ps, argc, argv, optstring);
}